

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.cpp
# Opt level: O0

pixel_format crnlib::pixel_format_helpers::convert_crn_format_to_pixel_format(crn_format fmt)

{
  crn_format fmt_local;
  
  switch(fmt) {
  case cCRNFmtDXT1:
    fmt_local._4_4_ = 0x31545844;
    break;
  case cCRNFmtDXT3:
    fmt_local._4_4_ = 0x33545844;
    break;
  case cCRNFmtDXT5:
    fmt_local._4_4_ = 0x35545844;
    break;
  case cCRNFmtDXT5_CCxY:
    fmt_local._4_4_ = 0x59784343;
    break;
  case cCRNFmtDXT5_xGxR:
    fmt_local._4_4_ = 0x52784778;
    break;
  case cCRNFmtDXT5_xGBR:
    fmt_local._4_4_ = 0x52424778;
    break;
  case cCRNFmtDXT5_AGBR:
    fmt_local._4_4_ = 0x52424741;
    break;
  case cCRNFmtDXN_XY:
    fmt_local._4_4_ = 0x59583241;
    break;
  case cCRNFmtDXN_YX:
    fmt_local._4_4_ = 0x32495441;
    break;
  case cCRNFmtDXT5A:
    fmt_local._4_4_ = 0x31495441;
    break;
  case cCRNFmtETC1:
    fmt_local._4_4_ = 0x31435445;
    break;
  case cCRNFmtETC2:
    fmt_local._4_4_ = 0x32435445;
    break;
  case cCRNFmtETC2A:
    fmt_local._4_4_ = 0x41325445;
    break;
  case cCRNFmtETC1S:
    fmt_local._4_4_ = 0x53315445;
    break;
  case cCRNFmtETC2AS:
    fmt_local._4_4_ = 0x53413245;
    break;
  default:
    fmt_local._4_4_ = cCRNFmtDXT1 >> 0x20;
  }
  return fmt_local._4_4_;
}

Assistant:

pixel_format convert_crn_format_to_pixel_format(crn_format fmt)
        {
            switch (fmt)
            {
            case cCRNFmtDXT1:
                return PIXEL_FMT_DXT1;
            case cCRNFmtDXT3:
                return PIXEL_FMT_DXT3;
            case cCRNFmtDXT5:
                return PIXEL_FMT_DXT5;
            case cCRNFmtDXT5_CCxY:
                return PIXEL_FMT_DXT5_CCxY;
            case cCRNFmtDXT5_xGxR:
                return PIXEL_FMT_DXT5_xGxR;
            case cCRNFmtDXT5_xGBR:
                return PIXEL_FMT_DXT5_xGBR;
            case cCRNFmtDXT5_AGBR:
                return PIXEL_FMT_DXT5_AGBR;
            case cCRNFmtDXN_XY:
                return PIXEL_FMT_DXN;
            case cCRNFmtDXN_YX:
                return PIXEL_FMT_3DC;
            case cCRNFmtDXT5A:
                return PIXEL_FMT_DXT5A;
            case cCRNFmtETC1:
                return PIXEL_FMT_ETC1;
            case cCRNFmtETC2:
                return PIXEL_FMT_ETC2;
            case cCRNFmtETC2A:
                return PIXEL_FMT_ETC2A;
            case cCRNFmtETC1S:
                return PIXEL_FMT_ETC1S;
            case cCRNFmtETC2AS:
                return PIXEL_FMT_ETC2AS;
            default: {
                CRNLIB_ASSERT(false);
                break;
            }
            }

            return PIXEL_FMT_INVALID;
        }